

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O2

void __thiscall
BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
::insert(BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *this,Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
               *entry)

{
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *this_00;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  **ppBVar1;
  
  loose_insert(this,entry);
  if (2 < this->data_size) {
    this_00 = (BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *)operator_new(0x40);
    BPlusTree(this_00,this->duplicates_allowed);
    b_array::
    copy_array<Map::Pair<std::__cxx11::string,MultiMap::MultiMap<std::__cxx11::string,long>>>
              (&this->data,&this_00->data,this->data_size,(size_t *)this_00);
    b_array::
    copy_array<BPlusTree<Map::Pair<std::__cxx11::string,MultiMap::MultiMap<std::__cxx11::string,long>>>*>
              (&this->subset,&this_00->subset,this->subset_size,&this_00->subset_size);
    erase_node(this);
    ppBVar1 = b_array::
              Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>_*>
              ::operator[](&this->subset,0);
    *ppBVar1 = this_00;
    this->subset_size = 1;
    fix_excess(this,0);
    return;
  }
  return;
}

Assistant:

void BPlusTree<T>::insert(const T& entry) {
    // the function that called this has to be root
    loose_insert(entry);
    // so do root checks here
    if (data_size > MAXIMUM) {
        // create new temp node
        BPlusTree<T>* temp = new BPlusTree<T>(duplicates_allowed);
        // copy data to temp node
        b_array::copy_array(data, temp->data, data_size, temp->data_size);
        b_array::copy_array(subset, temp->subset, subset_size, temp->subset_size);
        // wipe root data
        erase_node();
        // point root to temp
        subset[0] = temp;
        subset_size = 1;
        // call fix_excess
        fix_excess(0);
    }
}